

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O1

void __thiscall
wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  pointer pLVar1;
  HeapType this_00;
  bool bVar2;
  Struct *pSVar3;
  StructValues<wasm::LUBFinder> *pSVar4;
  Type TVar5;
  ulong uVar6;
  ulong uVar7;
  HeapType local_50;
  HeapType oldStructType_local;
  Type local_40;
  Type oldType;
  
  local_50.id = oldStructType.id;
  oldStructType_local.id = (uintptr_t)this;
  pSVar3 = HeapType::getStruct(&local_50);
  if ((struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    uVar7 = 1;
    oldType.id = (uintptr_t)struct_;
    do {
      local_40.id = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar6].type.id;
      bVar2 = wasm::Type::isRef(&local_40);
      this_00 = oldStructType_local;
      if (bVar2) {
        pSVar4 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                           ((StructValuesMap<wasm::LUBFinder> *)
                            (*(long *)(oldStructType_local.id + 0x68) + 0x30),local_50);
        pLVar1 = (pSVar4->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                 super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pSVar4->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                          super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 3) <= uVar6) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                        ,0x22,
                        "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                       );
        }
        TVar5 = GlobalTypeRewriter::getTempType(this_00.id,pLVar1[uVar6].lub.id);
        *(uintptr_t *)(*(long *)oldType.id + uVar6 * 0x10) = TVar5.id;
      }
      bVar2 = uVar7 < (ulong)(*(long *)(oldType.id + 8) - *(long *)oldType.id >> 4);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }